

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int normal_scanAtts(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  uint uVar10;
  ATTRIBUTE *pAVar12;
  byte *pbVar13;
  char **ppcVar14;
  char **ppcVar15;
  byte *pbVar16;
  byte *extraout_RDX;
  byte *extraout_RDX_00;
  byte *extraout_RDX_01;
  byte *extraout_RDX_02;
  char *extraout_RDX_03;
  byte *extraout_RDX_04;
  char *extraout_RDX_05;
  byte *extraout_RDX_06;
  char *extraout_RDX_07;
  byte *extraout_RDX_08;
  byte *extraout_RDX_09;
  byte *extraout_RDX_10;
  byte *extraout_RDX_11;
  byte *extraout_RDX_12;
  byte *extraout_RDX_13;
  byte *extraout_RDX_14;
  ulong uVar17;
  byte *pbVar18;
  int unaff_EBP;
  byte *local_50;
  char *local_48;
  char **local_40;
  char *local_38;
  uint uVar11;
  
  lVar7 = (long)end - (long)ptr;
  if (0 < lVar7) {
    pcVar9 = end + -1;
    local_38 = end + -2;
    pbVar16 = (byte *)end;
    local_50 = (byte *)ptr;
    local_40 = nextTokPtr;
    do {
      pbVar18 = local_50;
      uVar11 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*local_50);
      uVar10 = uVar11 - 5;
      if (0x18 < uVar10) {
switchD_006767a6_caseD_8:
        *nextTokPtr = (char *)local_50;
        return 0;
      }
      pAVar12 = (ATTRIBUTE *)
                ((long)&switchD_006767a6::switchdataD_0089f17c +
                (long)(int)(&switchD_006767a6::switchdataD_0089f17c)[uVar10]);
      switch(uVar11) {
      case 5:
        if (lVar7 == 1) {
          return -2;
        }
        iVar5 = (*enc[3].nameLength)(enc,(char *)local_50);
        if ((iVar5 != 0) ||
           (iVar5 = (*enc[3].scanners[0])(enc,(char *)pbVar18,extraout_RDX_07,&pAVar12->name),
           iVar5 == 0)) {
LAB_00676d8f:
          *local_40 = (char *)pbVar18;
          return 0;
        }
        local_50 = pbVar18 + 2;
        pbVar16 = extraout_RDX_08;
        nextTokPtr = local_40;
        break;
      case 6:
        if (lVar7 < 3) {
          return -2;
        }
        pcVar8 = (*enc[3].skipS)(enc,(char *)local_50);
        if (((int)pcVar8 != 0) ||
           (iVar5 = (*enc[3].scanners[1])(enc,(char *)pbVar18,extraout_RDX_05,&pAVar12->name),
           iVar5 == 0)) goto LAB_00676d8f;
        local_50 = pbVar18 + 3;
        pbVar16 = extraout_RDX_06;
        nextTokPtr = local_40;
        break;
      case 7:
        if (lVar7 < 4) {
          return -2;
        }
        iVar5 = (*enc[3].getAtts)(enc,(char *)local_50,(int)pbVar16,pAVar12);
        if ((iVar5 != 0) ||
           (iVar5 = (*enc[3].scanners[2])(enc,(char *)pbVar18,extraout_RDX_03,&pAVar12->name),
           iVar5 == 0)) goto LAB_00676d8f;
        local_50 = pbVar18 + 4;
        pbVar16 = extraout_RDX_04;
        nextTokPtr = local_40;
        break;
      default:
        goto switchD_006767a6_caseD_8;
      case 9:
      case 10:
      case 0x15:
        lVar7 = (long)pcVar9 - (long)local_50;
        do {
          local_50 = local_50 + 1;
          iVar5 = 1;
          if (lVar7 < 1) {
            unaff_EBP = -1;
          }
          else {
            bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*local_50);
            if (bVar2 - 9 < 2) {
LAB_006767eb:
              iVar5 = 0;
            }
            else if (bVar2 == 0xe) {
              iVar5 = 5;
            }
            else {
              if (bVar2 == 0x15) goto LAB_006767eb;
              *nextTokPtr = (char *)local_50;
              unaff_EBP = 0;
            }
          }
          lVar7 = lVar7 + -1;
        } while (iVar5 == 0);
        if (iVar5 == 1) {
          return unaff_EBP;
        }
      case 0xe:
        pbVar18 = local_50 + 1;
        pbVar16 = local_50;
        if ((byte *)end == pbVar18 || (long)end - (long)pbVar18 < 0) {
LAB_00676b27:
          bVar3 = true;
          unaff_EBP = -1;
        }
        else {
          bVar2 = *(byte *)((long)enc[1].scanners + (ulong)local_50[1]);
          uVar17 = CONCAT71((int7)((ulong)pcVar9 >> 8),bVar2);
          local_48 = pcVar9;
          if ((bVar2 & 0xfe) != 0xc) {
            lVar7 = (long)local_38 - (long)local_50;
            do {
              local_50 = pbVar18;
              if ((0x15 < (byte)uVar17) ||
                 (pbVar16 = (byte *)(uVar17 & 0xff), (0x200600U >> ((uint)pbVar16 & 0x1f) & 1) == 0)
                 ) {
                *nextTokPtr = (char *)local_50;
                bVar3 = true;
                pbVar18 = local_50;
                unaff_EBP = 0;
                goto LAB_00676bea;
              }
              pbVar18 = (byte *)end;
              if (lVar7 < 1) goto LAB_00676b27;
              uVar17 = CONCAT71((int7)(uVar17 >> 8),
                                *(undefined1 *)((long)enc[1].scanners + (ulong)local_50[1]));
              pbVar16 = (byte *)(uVar17 & 0xfffffffe);
              lVar7 = lVar7 + -1;
              pbVar18 = local_50 + 1;
            } while ((char)pbVar16 != '\f');
          }
          pbVar16 = local_50 + 2;
          local_50 = pbVar16;
          iVar5 = unaff_EBP;
          do {
            pbVar18 = local_50;
            lVar7 = (long)end - (long)local_50;
            iVar6 = 1;
            bVar3 = true;
            if (lVar7 < 1) {
              iVar5 = -1;
LAB_00676900:
              bVar3 = true;
              goto LAB_00676903;
            }
            bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*local_50);
            pbVar16 = (byte *)(ulong)bVar2;
            if (bVar2 == (byte)uVar17) {
              iVar6 = 0xb;
              bVar3 = false;
              goto LAB_00676903;
            }
            uVar10 = (uint)bVar2;
            if (8 < uVar10) {
switchD_006768f9_caseD_4:
              local_50 = local_50 + 1;
              bVar3 = false;
              iVar6 = 0;
              goto LAB_00676903;
            }
            pbVar16 = (byte *)((long)&switchD_006768f9::switchdataD_0089f1e0 +
                              (long)(int)(&switchD_006768f9::switchdataD_0089f1e0)[uVar10]);
            switch(uVar10) {
            default:
              *nextTokPtr = (char *)local_50;
              iVar5 = 0;
              goto LAB_00676900;
            case 3:
              iVar4 = normal_scanRef(enc,(char *)(local_50 + 1),end,(char **)&local_50);
              bVar3 = false;
              iVar6 = 0;
              pbVar16 = extraout_RDX_01;
              nextTokPtr = local_40;
              if (iVar4 < 1) {
                if (iVar4 == 0) {
                  *local_40 = (char *)local_50;
                }
                bVar3 = true;
                iVar6 = 1;
                iVar5 = iVar4;
              }
              break;
            case 4:
              goto switchD_006768f9_caseD_4;
            case 5:
              if (lVar7 == 1) {
LAB_00676956:
                iVar5 = -2;
              }
              else {
                iVar6 = (*enc[3].nameLength)(enc,(char *)local_50);
                pbVar16 = extraout_RDX;
                if (iVar6 == 0) {
                  local_50 = pbVar18 + 2;
                  goto LAB_006769df;
                }
LAB_006769c4:
                *local_40 = (char *)pbVar18;
                bVar3 = true;
                iVar6 = 1;
                nextTokPtr = local_40;
                iVar5 = 0;
              }
              break;
            case 6:
              if (lVar7 < 3) goto LAB_00676956;
              pcVar9 = (*enc[3].skipS)(enc,(char *)local_50);
              pbVar16 = extraout_RDX_00;
              if ((int)pcVar9 != 0) goto LAB_006769c4;
              local_50 = pbVar18 + 3;
              goto LAB_006769df;
            case 7:
              if (lVar7 < 4) goto LAB_00676956;
              iVar6 = (*enc[3].getAtts)(enc,(char *)local_50,(int)pbVar16,(ATTRIBUTE *)&DAT_00000001
                                       );
              pbVar16 = extraout_RDX_02;
              if (iVar6 != 0) goto LAB_006769c4;
              local_50 = pbVar18 + 4;
LAB_006769df:
              bVar3 = false;
              iVar6 = 0;
              nextTokPtr = local_40;
            }
LAB_00676903:
          } while (iVar6 == 0);
          pcVar9 = local_48;
          pbVar18 = local_50;
          unaff_EBP = iVar5;
          if (iVar6 == 0xb) {
            pbVar13 = local_50 + 1;
            pbVar16 = (byte *)(end + -(long)pbVar13);
            unaff_EBP = -1;
            bVar3 = true;
            pbVar18 = pbVar13;
            if (0 < (long)pbVar16) {
              bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar13);
              pbVar16 = (byte *)(ulong)bVar2;
              if (bVar2 < 0x11) {
                if (bVar2 - 9 < 2) {
LAB_00676b47:
                  pbVar16 = (byte *)(end + -(long)(local_50 + 2));
                  pbVar18 = local_50 + 2;
                  if (0 < (long)pbVar16) {
                    pbVar16 = (byte *)(end + -(long)pbVar13);
                    lVar7 = 1;
                    ppcVar14 = (char **)0x0;
LAB_00676b68:
                    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)pbVar13[lVar7])) {
                    case 5:
                      pbVar18 = pbVar13 + (1 - (long)ppcVar14);
                      if (pbVar16 + (long)ppcVar14 == (byte *)0x2) {
                        pbVar16 = (byte *)0x2;
                        unaff_EBP = -2;
                        goto LAB_00676bea;
                      }
                      ppcVar15 = ppcVar14;
                      local_50 = pbVar18;
                      iVar6 = (*enc[3].nameLength)(enc,(char *)pbVar18);
                      pbVar16 = extraout_RDX_13;
                      if ((iVar6 == 0) &&
                         (iVar6 = (*enc[3].literalScanners[0])
                                            (enc,(char *)pbVar18,(char *)extraout_RDX_13,ppcVar15),
                         pbVar16 = extraout_RDX_14, iVar6 != 0)) {
                        pbVar18 = pbVar13 + (3 - (long)ppcVar14);
                        goto LAB_00676d5e;
                      }
                      break;
                    case 6:
                      pbVar18 = pbVar13 + (1 - (long)ppcVar14);
                      ppcVar15 = (char **)((byte *)((long)ppcVar14 + (long)pbVar16) + -1);
                      unaff_EBP = -2;
                      if (ppcVar15 < (char **)0x3) goto LAB_00676bea;
                      local_50 = pbVar18;
                      pcVar9 = (*enc[3].skipS)(enc,(char *)pbVar18);
                      pbVar16 = extraout_RDX_11;
                      if (((int)pcVar9 == 0) &&
                         (iVar6 = (*enc[3].literalScanners[1])
                                            (enc,(char *)pbVar18,(char *)extraout_RDX_11,ppcVar15),
                         pbVar16 = extraout_RDX_12, iVar6 != 0)) {
                        pbVar18 = pbVar13 + (4 - (long)ppcVar14);
LAB_00676d5e:
                        bVar3 = false;
                        pcVar9 = local_48;
                        nextTokPtr = local_40;
                        unaff_EBP = iVar5;
                        goto LAB_00676bea;
                      }
                      break;
                    case 7:
                      pbVar18 = pbVar13 + (1 - (long)ppcVar14);
                      pAVar12 = (ATTRIBUTE *)((byte *)((long)ppcVar14 + (long)pbVar16) + -1);
                      unaff_EBP = -2;
                      if (pAVar12 < (ATTRIBUTE *)0x4) goto LAB_00676bea;
                      local_50 = pbVar18;
                      iVar6 = (*enc[3].getAtts)(enc,(char *)pbVar18,(int)pbVar16,pAVar12);
                      pbVar16 = extraout_RDX_09;
                      if ((iVar6 == 0) &&
                         (iVar6 = (*enc[3].nameMatchesAscii)
                                            (enc,(char *)pbVar18,(char *)extraout_RDX_09,
                                             (char *)pAVar12), pbVar16 = extraout_RDX_10, iVar6 != 0
                         )) {
                        pbVar18 = pbVar13 + (5 - (long)ppcVar14);
                        goto LAB_00676d5e;
                      }
                      break;
                    default:
                      local_50 = pbVar13 + (1 - (long)ppcVar14);
                      *nextTokPtr = (char *)local_50;
                      goto LAB_00676d38;
                    case 9:
                    case 10:
                    case 0x15:
                      goto switchD_00676b8b_caseD_9;
                    case 0xb:
                      local_50 = pbVar13 + (1 - (long)ppcVar14);
                      goto LAB_00676a4f;
                    case 0x11:
                      pbVar13 = pbVar13 + (1 - (long)ppcVar14);
                      goto LAB_00676c25;
                    case 0x16:
                    case 0x18:
                      bVar3 = false;
                      pbVar18 = pbVar13 + (2 - (long)ppcVar14);
                      unaff_EBP = iVar5;
                      goto LAB_00676bea;
                    }
                    *local_40 = (char *)pbVar18;
                    nextTokPtr = local_40;
LAB_00676d38:
                    pcVar9 = local_48;
                    pbVar18 = local_50;
                    unaff_EBP = 0;
                  }
                }
                else {
                  local_50 = pbVar13;
                  if (bVar2 == 0xb) {
LAB_00676a4f:
                    *nextTokPtr = (char *)(local_50 + 1);
                    pbVar18 = local_50;
                    unaff_EBP = 1;
                  }
                  else {
LAB_00676bb9:
                    *nextTokPtr = (char *)pbVar13;
                    local_50 = pbVar13;
LAB_00676c54:
                    pbVar18 = local_50;
                    unaff_EBP = 0;
                  }
                }
              }
              else {
                if (bVar2 != 0x11) {
                  if (bVar2 != 0x15) goto LAB_00676bb9;
                  goto LAB_00676b47;
                }
LAB_00676c25:
                local_50 = pbVar13;
                pbVar16 = local_50 + 1;
                pbVar18 = pbVar16;
                if ((byte *)end != pbVar16 && -1 < (long)end - (long)pbVar16) {
                  if (*pbVar16 != 0x3e) {
                    *nextTokPtr = (char *)pbVar16;
                    local_50 = pbVar16;
                    goto LAB_00676c54;
                  }
                  *nextTokPtr = (char *)(local_50 + 2);
                  unaff_EBP = 3;
                }
              }
            }
          }
        }
LAB_00676bea:
        local_50 = pbVar18;
        if (bVar3) {
          return unaff_EBP;
        }
        break;
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        local_50 = local_50 + 1;
      }
      lVar7 = (long)end - (long)local_50;
    } while (0 < lVar7);
  }
  return -1;
switchD_00676b8b_caseD_9:
  pbVar1 = pbVar16 + (long)ppcVar14;
  ppcVar14 = (char **)((long)ppcVar14 + -1);
  lVar7 = lVar7 + 1;
  pbVar18 = (byte *)end;
  if (pbVar1 == (byte *)0x2 || (long)(pbVar1 + -2) < 0) goto LAB_00676bea;
  goto LAB_00676b68;
}

Assistant:

static int PTRCALL
PREFIX(scanAtts)(const ENCODING *enc, const char *ptr, const char *end,
                 const char **nextTokPtr) {
#  ifdef XML_NS
  int hadColon = 0;
#  endif
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
#  ifdef XML_NS
    case BT_COLON:
      if (hadColon) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      hadColon = 1;
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      switch (BYTE_TYPE(enc, ptr)) {
        CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
      default:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      break;
#  endif
    case BT_S:
    case BT_CR:
    case BT_LF:
      for (;;) {
        int t;

        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        t = BYTE_TYPE(enc, ptr);
        if (t == BT_EQUALS)
          break;
        switch (t) {
        case BT_S:
        case BT_LF:
        case BT_CR:
          break;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
      }
      /* fall through */
    case BT_EQUALS: {
      int open;
#  ifdef XML_NS
      hadColon = 0;
#  endif
      for (;;) {
        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        open = BYTE_TYPE(enc, ptr);
        if (open == BT_QUOT || open == BT_APOS)
          break;
        switch (open) {
        case BT_S:
        case BT_LF:
        case BT_CR:
          break;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
      }
      ptr += MINBPC(enc);
      /* in attribute value */
      for (;;) {
        int t;
        REQUIRE_CHAR(enc, ptr, end);
        t = BYTE_TYPE(enc, ptr);
        if (t == open)
          break;
        switch (t) {
          INVALID_CASES(ptr, nextTokPtr)
        case BT_AMP: {
          int tok = PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, &ptr);
          if (tok <= 0) {
            if (tok == XML_TOK_INVALID)
              *nextTokPtr = ptr;
            return tok;
          }
          break;
        }
        case BT_LT:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        default:
          ptr += MINBPC(enc);
          break;
        }
      }
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S:
      case BT_CR:
      case BT_LF:
        break;
      case BT_SOL:
        goto sol;
      case BT_GT:
        goto gt;
      default:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      /* ptr points to closing quote */
      for (;;) {
        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        switch (BYTE_TYPE(enc, ptr)) {
          CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
        case BT_S:
        case BT_CR:
        case BT_LF:
          continue;
        case BT_GT:
        gt:
          *nextTokPtr = ptr + MINBPC(enc);
          return XML_TOK_START_TAG_WITH_ATTS;
        case BT_SOL:
        sol:
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          if (! CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          *nextTokPtr = ptr + MINBPC(enc);
          return XML_TOK_EMPTY_ELEMENT_WITH_ATTS;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
        break;
      }
      break;
    }
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}